

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

void __thiscall cmCTestGIT::CommitParser::~CommitParser(CommitParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DiffParser).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__CommitParser_0094bac0;
  cmCTestVC::Revision::~Revision(&this->Rev);
  (this->super_DiffParser).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DiffParser_0094bb20;
  pcVar2 = (this->super_DiffParser).CurChange.Path._M_dataplus._M_p;
  paVar1 = &(this->super_DiffParser).CurChange.Path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
            (&(this->super_DiffParser).Changes);
  (this->super_DiffParser).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  pcVar2 = (this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p;
  paVar1 = &(this->super_DiffParser).super_LineParser.Line.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x198);
  return;
}

Assistant:

CommitParser(cmCTestGIT* git, const char* prefix)
    : DiffParser(git, prefix)
  {
    this->Separator = SectionSep[this->Section];
  }